

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

void CVmBifTADS::re_search_common<_1>(uint argc)

{
  ushort *p_00;
  vm_globalvar_t *pvVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  vm_datatype_t *pvVar3;
  vm_val_t *pvVar4;
  undefined4 uVar5;
  vm_val_t *pvVar6;
  int iVar7;
  vm_obj_id_t vVar8;
  ushort *puVar9;
  size_t sVar10;
  size_t intval;
  int32_t iVar11;
  char *p_01;
  int i;
  int iVar12;
  ulong bytecnt;
  int match_len;
  utf8_ptr p;
  CVmObjPageEntry *local_68;
  size_t len;
  ushort *local_58;
  char *dst;
  char buf [17];
  
  CVmBif::check_argc_range(argc,2,3);
  pvVar6 = sp_;
  pvVar4 = sp_ + -2;
  uVar5 = *(undefined4 *)&sp_[-2].field_0x4;
  aVar2 = sp_[-2].val;
  sp_ = sp_ + 1;
  pvVar6->typ = pvVar4->typ;
  *(undefined4 *)&pvVar6->field_0x4 = uVar5;
  pvVar6->val = aVar2;
  pvVar4 = sp_;
  iVar11 = 0;
  uVar5 = *(undefined4 *)&pvVar6[-1].field_0x4;
  aVar2 = pvVar6[-1].val;
  sp_ = sp_ + 1;
  pvVar4->typ = pvVar6[-1].typ;
  *(undefined4 *)&pvVar4->field_0x4 = uVar5;
  pvVar4->val = aVar2;
  if (2 < argc) {
    if (pvVar6[-3].typ != VM_INT) {
      err_throw(0x900);
    }
    iVar11 = pvVar6[-3].val.intval;
  }
  pvVar1 = G_bif_tads_globals_X->last_rex_str;
  uVar5 = *(undefined4 *)&pvVar6[-2].field_0x4;
  aVar2 = pvVar6[-2].val;
  (pvVar1->val).typ = pvVar6[-2].typ;
  *(undefined4 *)&(pvVar1->val).field_0x4 = uVar5;
  (pvVar1->val).val = aVar2;
  CRegexSearcherSimple::clear_group_regs(G_bif_tads_globals_X->rex_searcher);
  if (sp_[-1].typ == VM_OBJ) {
    iVar7 = CVmObjPattern::is_pattern_obj(sp_[-1].val.obj);
    if (iVar7 != 0) {
      local_68 = G_obj_table_X.pages_[sp_[-1].val.obj >> 0xc] + (sp_[-1].val.obj & 0xfff);
      local_58 = (ushort *)0x0;
      sp_ = sp_ + -1;
      goto LAB_0022473a;
    }
  }
  local_68 = (CVmObjPageEntry *)0x0;
  local_58 = (ushort *)CVmBif::pop_str_val();
LAB_0022473a:
  puVar9 = (ushort *)CVmBif::pop_str_val();
  p_00 = puVar9 + 1;
  bytecnt = (ulong)*puVar9;
  p.p_ = (char *)p_00;
  len = bytecnt;
  if (iVar11 < 1) {
    sVar10 = utf8_ptr::s_len((char *)p_00,bytecnt);
    iVar7 = (int)sVar10;
  }
  else {
    iVar7 = -1;
  }
  iVar12 = iVar7 + iVar11;
  while ((0 < iVar12 && (bytecnt != 0))) {
    iVar12 = iVar12 + -1;
    utf8_ptr::inc(&p,&len);
    bytecnt = len;
  }
  if (local_68 == (CVmObjPageEntry *)0x0) {
    iVar12 = CRegexSearcherSimple::compile_and_search_back
                       (G_bif_tads_globals_X->rex_searcher,(char *)(local_58 + 1),(ulong)*local_58,
                        (char *)p_00,p.p_,bytecnt,&match_len);
  }
  else {
    iVar12 = CRegexSearcherSimple::search_back_for_pattern
                       (G_bif_tads_globals_X->rex_searcher,
                        (re_compiled_pattern *)**(undefined8 **)((long)&local_68->ptr_ + 8),
                        (char *)p_00,p.p_,bytecnt,&match_len);
  }
  if (iVar12 < 0) {
    CVmBif::retval_nil();
  }
  else {
    sVar10 = utf8_ptr::s_len((char *)p_00,(long)((iVar7 + iVar11) - iVar12));
    p_01 = p.p_ + -iVar12;
    intval = utf8_ptr::s_len(p_01,(long)match_len);
    vVar8 = CVmObjString::create(0,p_01,(long)match_len);
    pvVar4 = sp_;
    pvVar3 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar3 = VM_OBJ;
    (pvVar4->val).obj = vVar8;
    dst = buf + 2;
    buf[0] = '\x03';
    buf[1] = '\0';
    put_list_int(&dst,sVar10 + 1);
    put_list_int(&dst,intval);
    put_list_obj(&dst,vVar8);
    vVar8 = CVmObjList::create(0,buf);
    CVmBif::retval_obj(vVar8);
    sp_ = sp_ + -1;
  }
  sp_ = sp_ + -(long)(int)argc;
  return;
}

Assistant:

inline void CVmBifTADS::re_search_common(VMG_ uint argc)
{
    /* check arguments */
    check_argc_range(vmg_ argc, 2, 3);

    /* 
     *   make copies of the arguments, so we can pop the values without
     *   actually removing them from the stack - leave the originals on the
     *   stack for gc protection 
     */
    vm_val_t *v1 = G_stk->get(0);
    vm_val_t *v2 = G_stk->get(1);
    vm_val_t *v3 = (argc >= 3 ? G_stk->get(2) : 0);
    G_stk->push(v2);
    G_stk->push(v1);

    /* note the starting index, if given */
    int start_idx = (dir > 0 ? 1 : 0);
    if (v3 != 0)
    {
        /* check the type */
        if (v3->typ != VM_INT)
            err_throw(VMERR_BAD_TYPE_BIF);

        /* get the value */
        start_idx = (int)v3->val.intval;
    }

    /* 
     *   remember the last search string (the second argument), and clear out
     *   any old group registers (since they'd point into the old string) 
     */
    G_bif_tads_globals->last_rex_str->val = *v2;
    G_bif_tads_globals->rex_searcher->clear_group_regs();

    /* check to see if we have a RexPattern object or an uncompiled string */
    const char *pat_str = 0;
    CVmObjPattern *pat_obj = 0;
    if (G_stk->get(0)->typ == VM_OBJ
        && CVmObjPattern::is_pattern_obj(vmg_ G_stk->get(0)->val.obj))
    {
        vm_val_t pat_val;

        /* get the pattern object */
        G_stk->pop(&pat_val);
        pat_obj = (CVmObjPattern *)vm_objp(vmg_ pat_val.val.obj);
    }
    else
    {
        /* get the pattern string */
        pat_str = pop_str_val(vmg0_);
    }

    /* get the string to search for the pattern */
    const char *str = pop_str_val(vmg0_);
    utf8_ptr p((char *)str + VMB_LEN);
    size_t len = vmb_get_len(str);

    /* if the starting index is negative, it's from the end of the string */
    start_idx += (start_idx < 0 ? (int)p.len(len) :
                  start_idx == 0 && dir < 0 ? (int)p.len(len) :
                  -1);

    /* skip to the starting index */
    for (int i = start_idx ; i > 0 && len != 0 ; --i, p.inc(&len)) ;

    /* search for the pattern */
    int match_idx;
    int match_len;
    if (pat_obj != 0)
    {
        /* try finding the compiled pattern */
        match_idx =
            (dir > 0
             ? G_bif_tads_globals->rex_searcher->search_for_pattern(
                 pat_obj->get_pattern(vmg0_),
                 str + VMB_LEN, p.getptr(), len, &match_len)
             : G_bif_tads_globals->rex_searcher->search_back_for_pattern(
                 pat_obj->get_pattern(vmg0_),
                 str + VMB_LEN, p.getptr(), len, &match_len));
    }
    else
    {
        /* try finding the regular expression string pattern */
        match_idx =
            (dir > 0
             ? G_bif_tads_globals->rex_searcher->compile_and_search(
                 pat_str + VMB_LEN, vmb_get_len(pat_str),
                 str + VMB_LEN, p.getptr(), len, &match_len)
             : G_bif_tads_globals->rex_searcher->compile_and_search_back(
                 pat_str + VMB_LEN, vmb_get_len(pat_str),
                 str + VMB_LEN, p.getptr(), len, &match_len));
    }

    /* check for a match */
    if (match_idx >= 0)
    {
        /* 
         *   We found a match - calculate the character index of the match
         *   offset, adjusted to a 1-base.  The character index is simply the
         *   number of characters in the part of the string up to the match
         *   index.  Note that we have to add the starting index to get the
         *   actual index in the overall string, since 'p' points to the
         *   character at the starting index.  Also note that when searching
         *   backwards, the match index is the number of characters *before*
         *   the starting point.
         */
        size_t char_idx;
        if (dir > 0)
            char_idx = p.len(match_idx) + start_idx + 1;
        else
            char_idx = utf8_ptr::s_len(
                str + VMB_LEN, start_idx - match_idx) + 1;

        /* calculate the character length of the match */
        utf8_ptr matchp(p.getptr() + dir*match_idx);
        size_t char_len = matchp.len(match_len);

        /* allocate a string containing the match */
        vm_obj_id_t match_str_obj =
            CVmObjString::create(vmg_ FALSE, matchp.getptr(), match_len);

        /* push it momentarily as protection against garbage collection */
        G_stk->push()->set_obj(match_str_obj);

        /* 
         *   set up a 3-element list to contain the return value:
         *   [match_start_index, match_length, match_string] 
         */
        char buf[VMB_LEN + VMB_DATAHOLDER * 3];
        vmb_put_len(buf, 3);
        char *dst = buf + VMB_LEN;
        put_list_int(&dst, (long)char_idx);
        put_list_int(&dst, (long)char_len);
        put_list_obj(&dst, match_str_obj);

        /* allocate and return the list */
        retval_obj(vmg_ CVmObjList::create(vmg_ FALSE, buf));

        /* we no longer need the garbage collection protection */
        G_stk->discard();
    }
    else
    {
        /* no match - return nil */
        retval_nil(vmg0_);
    }

    /* discard the arguments */
    G_stk->discard(argc);
}